

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

void cdef_filter_16_0_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined8 *puVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [16];
  uint uVar242;
  int iVar243;
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  uint in_stack_00000008;
  v128 res_128;
  v256_conflict tap [8];
  int *sec_taps;
  int *pri_taps;
  int s2o2;
  int s2o1;
  int s1o2;
  int s1o1;
  int po2;
  int po1;
  v256_conflict min;
  v256_conflict max;
  v256_conflict cdef_large_value_mask;
  v256_conflict res;
  v256_conflict row;
  v256_conflict p3;
  v256_conflict p2;
  v256_conflict p1;
  v256_conflict p0;
  v256_conflict sum;
  int i;
  int clipping_required;
  uint16_t *dst16;
  uint8_t *dst8;
  v128 res_128_1;
  v256_conflict tap_2 [8];
  v256_conflict tap_1 [4];
  int i_1;
  int *sec_taps_1;
  int *pri_taps_1;
  int s2o2_1;
  int s2o1_1;
  int s1o2_1;
  int s1o1_1;
  int po2_1;
  int po1_1;
  v256_conflict cdef_large_value_mask_1;
  v256_conflict min_1;
  v256_conflict max_1;
  v256_conflict res_1;
  v256_conflict row_1;
  v256_conflict sum_1;
  v256_conflict p3_1;
  v256_conflict p2_1;
  v256_conflict p1_1;
  v256_conflict p0_1;
  int clipping_required_1;
  uint16_t *dst16_1;
  uint8_t *dst8_1;
  v256_conflict s_15;
  v256_conflict sign_15;
  v256_conflict diff_15;
  v256_conflict s_14;
  v256_conflict sign_14;
  v256_conflict diff_14;
  v256_conflict s_13;
  v256_conflict sign_13;
  v256_conflict diff_13;
  v256_conflict s_12;
  v256_conflict sign_12;
  v256_conflict diff_12;
  v256_conflict s_23;
  v256_conflict sign_23;
  v256_conflict diff_23;
  v256_conflict s_22;
  v256_conflict sign_22;
  v256_conflict diff_22;
  v256_conflict s_21;
  v256_conflict sign_21;
  v256_conflict diff_21;
  v256_conflict s_20;
  v256_conflict sign_20;
  v256_conflict diff_20;
  v256_conflict s_19;
  v256_conflict sign_19;
  v256_conflict diff_19;
  v256_conflict s_18;
  v256_conflict sign_18;
  v256_conflict diff_18;
  v256_conflict s_17;
  v256_conflict sign_17;
  v256_conflict diff_17;
  v256_conflict s_16;
  v256_conflict sign_16;
  v256_conflict diff_16;
  v256_conflict s_3;
  v256_conflict sign_3;
  v256_conflict diff_3;
  v256_conflict s_2;
  v256_conflict sign_2;
  v256_conflict diff_2;
  v256_conflict s_1;
  v256_conflict sign_1;
  v256_conflict diff_1;
  v256_conflict s;
  v256_conflict sign;
  v256_conflict diff;
  v256_conflict s_11;
  v256_conflict sign_11;
  v256_conflict diff_11;
  v256_conflict s_10;
  v256_conflict sign_10;
  v256_conflict diff_10;
  v256_conflict s_9;
  v256_conflict sign_9;
  v256_conflict diff_9;
  v256_conflict s_8;
  v256_conflict sign_8;
  v256_conflict diff_8;
  v256_conflict s_7;
  v256_conflict sign_7;
  v256_conflict diff_7;
  v256_conflict s_6;
  v256_conflict sign_6;
  v256_conflict diff_6;
  v256_conflict s_5;
  v256_conflict sign_5;
  v256_conflict diff_5;
  v256_conflict s_4;
  v256_conflict sign_4;
  v256_conflict diff_4;
  v256_conflict max_u8_2;
  v256_conflict max_u8;
  v256_conflict max_u8_3;
  v256_conflict max_u8_1;
  uint local_e2ac;
  uint local_e2a0;
  uint local_e26c;
  uint local_e260;
  undefined8 uStack_e090;
  undefined8 uStack_e088;
  undefined8 local_e080;
  undefined8 uStack_e078;
  undefined8 *puStack_e068;
  undefined8 uStack_e050;
  undefined8 uStack_e048;
  int local_df90;
  uint local_df64;
  uint local_df60;
  int local_dccc;
  undefined8 uStack_dc90;
  undefined8 uStack_dc88;
  undefined8 uStack_dc10;
  undefined8 uStack_dc08;
  uint local_db24;
  uint local_db20;
  undefined8 local_dad0;
  undefined8 uStack_dac8;
  undefined8 local_d970;
  undefined8 uStack_d968;
  undefined8 local_d940;
  undefined8 uStack_d938;
  undefined8 local_d910;
  undefined8 uStack_d908;
  undefined8 local_d8e0;
  undefined8 uStack_d8d8;
  undefined8 local_d8b0;
  undefined8 uStack_d8a8;
  undefined8 local_d880;
  undefined8 uStack_d878;
  undefined8 local_d850;
  undefined8 uStack_d848;
  undefined8 local_d820;
  undefined8 uStack_d818;
  undefined8 local_d7f0;
  undefined8 uStack_d7e8;
  undefined8 local_d7c0;
  undefined8 uStack_d7b8;
  undefined8 local_d790;
  undefined8 uStack_d788;
  undefined8 local_d760;
  undefined8 uStack_d758;
  ulong local_d6e0;
  ulong uStack_d6d8;
  ulong uStack_d6d0;
  ulong uStack_d6c8;
  ulong local_d600;
  ulong uStack_d5f8;
  ulong uStack_d5f0;
  ulong uStack_d5e8;
  ulong local_d520;
  ulong uStack_d518;
  ulong uStack_d510;
  ulong uStack_d508;
  ulong local_d440;
  ulong uStack_d438;
  ulong uStack_d430;
  ulong uStack_d428;
  ulong local_d360;
  ulong uStack_d358;
  ulong uStack_d350;
  ulong uStack_d348;
  ulong local_d280;
  ulong uStack_d278;
  ulong uStack_d270;
  ulong uStack_d268;
  ulong local_d1a0;
  ulong uStack_d198;
  ulong uStack_d190;
  ulong uStack_d188;
  ulong local_d0c0;
  ulong uStack_d0b8;
  ulong uStack_d0b0;
  ulong uStack_d0a8;
  ulong local_cfe0;
  ulong uStack_cfd8;
  ulong uStack_cfd0;
  ulong uStack_cfc8;
  ulong local_cf00;
  ulong uStack_cef8;
  ulong uStack_cef0;
  ulong uStack_cee8;
  ulong local_ce20;
  ulong uStack_ce18;
  ulong uStack_ce10;
  ulong uStack_ce08;
  ulong local_cd40;
  ulong uStack_cd38;
  ulong uStack_cd30;
  ulong uStack_cd28;
  ulong local_cc60;
  ulong uStack_cc58;
  ulong uStack_cc50;
  ulong uStack_cc48;
  ulong local_cb80;
  ulong uStack_cb78;
  ulong uStack_cb70;
  ulong uStack_cb68;
  ulong local_caa0;
  ulong uStack_ca98;
  ulong uStack_ca90;
  ulong uStack_ca88;
  ulong local_c9c0;
  ulong uStack_c9b8;
  ulong uStack_c9b0;
  ulong uStack_c9a8;
  ushort local_c964;
  ulong local_c8e0;
  ulong uStack_c8d8;
  ulong uStack_c8d0;
  ulong uStack_c8c8;
  ulong local_c800;
  ulong uStack_c7f8;
  ulong uStack_c7f0;
  ulong uStack_c7e8;
  ulong local_c720;
  ulong uStack_c718;
  ulong uStack_c710;
  ulong uStack_c708;
  ulong local_c640;
  ulong uStack_c638;
  ulong uStack_c630;
  ulong uStack_c628;
  ulong local_c560;
  ulong uStack_c558;
  ulong uStack_c550;
  ulong uStack_c548;
  ulong local_c480;
  ulong uStack_c478;
  ulong uStack_c470;
  ulong uStack_c468;
  ulong local_c3a0;
  ulong uStack_c398;
  ulong uStack_c390;
  ulong uStack_c388;
  ulong local_c2c0;
  ulong uStack_c2b8;
  ulong uStack_c2b0;
  ulong uStack_c2a8;
  ushort local_c264;
  undefined8 local_93c0;
  undefined8 local_9380;
  undefined8 local_9340;
  undefined8 local_9300;
  undefined1 local_9210 [16];
  undefined8 local_9160;
  undefined8 uStack_9158;
  ulong uStack_9078;
  ulong uStack_9038;
  ulong local_74c0;
  ulong uStack_74b8;
  ulong uStack_74b0;
  ulong uStack_74a8;
  ulong local_7480;
  ulong uStack_7478;
  ulong uStack_7470;
  ulong uStack_7468;
  ulong local_7440;
  ulong uStack_7438;
  ulong uStack_7430;
  ulong uStack_7428;
  ulong local_7400;
  ulong uStack_73f8;
  ulong uStack_73f0;
  ulong uStack_73e8;
  ulong local_73c0;
  ulong uStack_73b8;
  ulong uStack_73b0;
  ulong uStack_73a8;
  ulong local_7380;
  ulong uStack_7378;
  ulong uStack_7370;
  ulong uStack_7368;
  ulong local_7340;
  ulong uStack_7338;
  ulong uStack_7330;
  ulong uStack_7328;
  ulong local_7300;
  ulong uStack_72f8;
  ulong uStack_72f0;
  ulong uStack_72e8;
  ulong local_72c0;
  ulong uStack_72b8;
  ulong uStack_72b0;
  ulong uStack_72a8;
  ulong local_7280;
  ulong uStack_7278;
  ulong uStack_7270;
  ulong uStack_7268;
  ulong local_7240;
  ulong uStack_7238;
  ulong uStack_7230;
  ulong uStack_7228;
  ulong local_7200;
  ulong uStack_71f8;
  ulong uStack_71f0;
  ulong uStack_71e8;
  ulong local_71c0;
  ulong uStack_71b8;
  ulong uStack_71b0;
  ulong uStack_71a8;
  ulong local_7180;
  ulong uStack_7178;
  ulong uStack_7170;
  ulong uStack_7168;
  ulong local_7140;
  ulong uStack_7138;
  ulong uStack_7130;
  ulong uStack_7128;
  ulong local_7100;
  ulong uStack_70f8;
  ulong uStack_70f0;
  ulong uStack_70e8;
  ulong local_70c0;
  ulong uStack_70b8;
  ulong uStack_70b0;
  ulong uStack_70a8;
  ulong local_7080;
  ulong uStack_7078;
  ulong uStack_7070;
  ulong uStack_7068;
  ulong local_7040;
  ulong uStack_7038;
  ulong uStack_7030;
  ulong uStack_7028;
  ulong local_7000;
  ulong uStack_6ff8;
  ulong uStack_6ff0;
  ulong uStack_6fe8;
  ulong local_6fc0;
  ulong uStack_6fb8;
  ulong uStack_6fb0;
  ulong uStack_6fa8;
  ulong local_6f80;
  ulong uStack_6f78;
  ulong uStack_6f70;
  ulong uStack_6f68;
  ulong local_6f40;
  ulong uStack_6f38;
  ulong uStack_6f30;
  ulong uStack_6f28;
  ulong local_6f00;
  ulong uStack_6ef8;
  ulong uStack_6ef0;
  ulong uStack_6ee8;
  ulong uStack_1d38;
  undefined8 local_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 local_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 local_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 local_1a10;
  undefined8 uStack_1a08;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 local_1930;
  undefined8 uStack_1928;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 local_1850;
  undefined8 uStack_1848;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_c964 = (ushort)in_ECX;
  local_c264 = (ushort)in_R8D;
  if (coeff_shift == 8) {
    local_df60 = in_stack_00000008;
    local_df64 = pri_damping;
    auVar247 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar247 = vpinsrw_avx(auVar247,0xbfff,2);
    auVar247 = vpinsrw_avx(auVar247,0xbfff,3);
    auVar247 = vpinsrw_avx(auVar247,0xbfff,4);
    auVar247 = vpinsrw_avx(auVar247,0xbfff,5);
    auVar247 = vpinsrw_avx(auVar247,0xbfff,6);
    auVar247 = vpinsrw_avx(auVar247,0xbfff,7);
    auVar244 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar244 = vpinsrw_avx(auVar244,0xbfff,2);
    auVar244 = vpinsrw_avx(auVar244,0xbfff,3);
    auVar244 = vpinsrw_avx(auVar244,0xbfff,4);
    auVar244 = vpinsrw_avx(auVar244,0xbfff,5);
    auVar244 = vpinsrw_avx(auVar244,0xbfff,6);
    auVar244 = vpinsrw_avx(auVar244,0xbfff,7);
    auVar244 = ZEXT116(0) * auVar247 + ZEXT116(1) * auVar244;
    auVar247 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar247;
    iVar3 = cdef_directions_padded[(long)in_R9D + 2][0];
    iVar4 = cdef_directions_padded[(long)in_R9D + 2][1];
    iVar5 = cdef_directions_padded[(long)(in_R9D + 2) + 2][0];
    iVar6 = cdef_directions_padded[(long)(in_R9D + 2) + 2][1];
    iVar7 = cdef_directions_padded[(long)(in_R9D + -2) + 2][0];
    iVar8 = cdef_directions_padded[(long)(in_R9D + -2) + 2][1];
    uVar242 = (int)in_ECX >> ((byte)sec_damping & 0x1f) & 1;
    if (in_ECX != 0) {
      iVar243 = get_msb(in_ECX);
      if ((int)(in_stack_00000008 - iVar243) < 0) {
        local_e260 = 0;
      }
      else {
        iVar243 = get_msb(in_ECX);
        local_e260 = in_stack_00000008 - iVar243;
      }
      local_df60 = local_e260;
    }
    if (in_R8D != 0) {
      iVar243 = get_msb(in_R8D);
      if (pri_damping - iVar243 < 0) {
        local_e26c = 0;
      }
      else {
        iVar243 = get_msb(in_R8D);
        local_e26c = pri_damping - iVar243;
      }
      local_df64 = local_e26c;
    }
    uStack_e088 = auVar247._8_8_;
    uStack_e090 = auVar247._0_8_;
    for (local_df90 = 0; local_df90 < block_width; local_df90 = local_df90 + 2) {
      auVar247 = *(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90) * 2);
      auVar245 = ZEXT116(0) * auVar247 +
                 ZEXT116(1) * *(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + 0x90) * 2);
      auVar247 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar247;
      uStack_e050 = auVar247._0_8_;
      uStack_e048 = auVar247._8_8_;
      auVar247 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar3) * 2));
      auVar9 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar3) * 2));
      local_d8e0 = auVar247._0_8_;
      uStack_d8d8 = auVar247._8_8_;
      auVar247 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar3) * 2));
      auVar250 = vlddqu_avx(*(undefined1 (*) [16])
                             (in_RDX + (long)((local_df90 * 0x90 - iVar3) + 0x90) * 2));
      local_d910 = auVar247._0_8_;
      uStack_d908 = auVar247._8_8_;
      auVar39._16_8_ = local_d8e0;
      auVar39._0_16_ = auVar9;
      auVar39._24_8_ = uStack_d8d8;
      auVar38._16_8_ = uStack_e050;
      auVar38._0_16_ = auVar245;
      auVar38._24_8_ = uStack_e048;
      auVar21 = vpsubw_avx2(auVar39,auVar38);
      auVar17 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,7);
      auVar13 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,2);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,3);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,4);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,5);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,6);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,7);
      uStack_730 = auVar13._0_8_;
      uStack_728 = auVar13._8_8_;
      auVar18 = vpsrlw_avx2(auVar21,ZEXT416(local_df60));
      auVar79._16_8_ = uStack_730;
      auVar79._0_16_ = auVar247;
      auVar79._24_8_ = uStack_728;
      auVar18 = vpsubusw_avx2(auVar79,auVar18);
      local_c9c0 = auVar17._0_8_;
      uStack_c9b8 = auVar17._8_8_;
      uStack_c9b0 = auVar17._16_8_;
      uStack_c9a8 = auVar17._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar18);
      auVar21 = vpaddw_avx2(auVar17,auVar21);
      local_72c0 = auVar21._0_8_;
      uStack_72b8 = auVar21._8_8_;
      uStack_72b0 = auVar21._16_8_;
      uStack_72a8 = auVar21._24_8_;
      auVar41._16_8_ = local_d910;
      auVar41._0_16_ = auVar250;
      auVar41._24_8_ = uStack_d908;
      auVar40._16_8_ = uStack_e050;
      auVar40._0_16_ = auVar245;
      auVar40._24_8_ = uStack_e048;
      auVar21 = vpsubw_avx2(auVar41,auVar40);
      auVar17 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,7);
      auVar13 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,2);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,3);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,4);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,5);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,6);
      auVar13 = vpinsrw_avx(auVar13,in_ECX & 0xffff,7);
      uStack_6f0 = auVar13._0_8_;
      uStack_6e8 = auVar13._8_8_;
      auVar18 = vpsrlw_avx2(auVar21,ZEXT416(local_df60));
      auVar78._16_8_ = uStack_6f0;
      auVar78._0_16_ = auVar247;
      auVar78._24_8_ = uStack_6e8;
      auVar18 = vpsubusw_avx2(auVar78,auVar18);
      local_caa0 = auVar17._0_8_;
      uStack_ca98 = auVar17._8_8_;
      uStack_ca90 = auVar17._16_8_;
      uStack_ca88 = auVar17._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar18);
      auVar21 = vpaddw_avx2(auVar17,auVar21);
      local_7280 = auVar21._0_8_;
      uStack_7278 = auVar21._8_8_;
      uStack_7270 = auVar21._16_8_;
      uStack_7268 = auVar21._24_8_;
      uVar2 = (ushort)cdef_pri_taps[(int)uVar242][0];
      auVar247 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,2);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,3);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,4);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,5);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,6);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,7);
      auVar13 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar13 = vpinsrw_avx(auVar13,(uint)uVar2,2);
      auVar13 = vpinsrw_avx(auVar13,(uint)uVar2,3);
      auVar13 = vpinsrw_avx(auVar13,(uint)uVar2,4);
      auVar13 = vpinsrw_avx(auVar13,(uint)uVar2,5);
      auVar13 = vpinsrw_avx(auVar13,(uint)uVar2,6);
      auVar13 = vpinsrw_avx(auVar13,(uint)uVar2,7);
      uStack_230 = auVar13._0_8_;
      uStack_228 = auVar13._8_8_;
      auVar99._8_8_ = uStack_72b8 ^ uStack_c9b8;
      auVar99._0_8_ = local_72c0 ^ local_c9c0;
      auVar99._16_8_ = uStack_72b0 ^ uStack_c9b0;
      auVar99._24_8_ = uStack_72a8 ^ uStack_c9a8;
      auVar98._8_8_ = uStack_7278 ^ uStack_ca98;
      auVar98._0_8_ = local_7280 ^ local_caa0;
      auVar98._16_8_ = uStack_7270 ^ uStack_ca90;
      auVar98._24_8_ = uStack_7268 ^ uStack_ca88;
      auVar21 = vpaddw_avx2(auVar99,auVar98);
      auVar118._16_8_ = uStack_230;
      auVar118._0_16_ = auVar247;
      auVar118._24_8_ = uStack_228;
      auVar21 = vpmullw_avx2(auVar118,auVar21);
      auVar17 = vpaddw_avx2(ZEXT1632(ZEXT816(0)),auVar21);
      auVar247 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar4) * 2));
      auVar13 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar4) * 2));
      local_d940 = auVar247._0_8_;
      uStack_d938 = auVar247._8_8_;
      auVar247 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar4) * 2));
      auVar10 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)((local_df90 * 0x90 - iVar4) + 0x90) * 2));
      local_d970 = auVar247._0_8_;
      uStack_d968 = auVar247._8_8_;
      auVar43._16_8_ = local_d940;
      auVar43._0_16_ = auVar13;
      auVar43._24_8_ = uStack_d938;
      auVar42._16_8_ = uStack_e050;
      auVar42._0_16_ = auVar245;
      auVar42._24_8_ = uStack_e048;
      auVar21 = vpsubw_avx2(auVar43,auVar42);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,7);
      auVar14 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar14 = vpinsrw_avx(auVar14,in_ECX & 0xffff,2);
      auVar14 = vpinsrw_avx(auVar14,in_ECX & 0xffff,3);
      auVar14 = vpinsrw_avx(auVar14,in_ECX & 0xffff,4);
      auVar14 = vpinsrw_avx(auVar14,in_ECX & 0xffff,5);
      auVar14 = vpinsrw_avx(auVar14,in_ECX & 0xffff,6);
      auVar14 = vpinsrw_avx(auVar14,in_ECX & 0xffff,7);
      uStack_6b0 = auVar14._0_8_;
      uStack_6a8 = auVar14._8_8_;
      auVar19 = vpsrlw_avx2(auVar21,ZEXT416(local_df60));
      auVar77._16_8_ = uStack_6b0;
      auVar77._0_16_ = auVar247;
      auVar77._24_8_ = uStack_6a8;
      auVar19 = vpsubusw_avx2(auVar77,auVar19);
      local_cb80 = auVar18._0_8_;
      uStack_cb78 = auVar18._8_8_;
      uStack_cb70 = auVar18._16_8_;
      uStack_cb68 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar19);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7240 = auVar21._0_8_;
      uStack_7238 = auVar21._8_8_;
      uStack_7230 = auVar21._16_8_;
      uStack_7228 = auVar21._24_8_;
      auVar45._16_8_ = local_d970;
      auVar45._0_16_ = auVar10;
      auVar45._24_8_ = uStack_d968;
      auVar44._16_8_ = uStack_e050;
      auVar44._0_16_ = auVar245;
      auVar44._24_8_ = uStack_e048;
      auVar21 = vpsubw_avx2(auVar45,auVar44);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,7);
      auVar14 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar14 = vpinsrw_avx(auVar14,in_ECX & 0xffff,2);
      auVar14 = vpinsrw_avx(auVar14,in_ECX & 0xffff,3);
      auVar14 = vpinsrw_avx(auVar14,in_ECX & 0xffff,4);
      auVar14 = vpinsrw_avx(auVar14,in_ECX & 0xffff,5);
      auVar14 = vpinsrw_avx(auVar14,in_ECX & 0xffff,6);
      auVar14 = vpinsrw_avx(auVar14,in_ECX & 0xffff,7);
      uStack_670 = auVar14._0_8_;
      uStack_668 = auVar14._8_8_;
      auVar19 = vpsrlw_avx2(auVar21,ZEXT416(local_df60));
      auVar76._16_8_ = uStack_670;
      auVar76._0_16_ = auVar247;
      auVar76._24_8_ = uStack_668;
      auVar19 = vpsubusw_avx2(auVar76,auVar19);
      local_cc60 = auVar18._0_8_;
      uStack_cc58 = auVar18._8_8_;
      uStack_cc50 = auVar18._16_8_;
      uStack_cc48 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar19);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7200 = auVar21._0_8_;
      uStack_71f8 = auVar21._8_8_;
      uStack_71f0 = auVar21._16_8_;
      uStack_71e8 = auVar21._24_8_;
      uVar2 = (ushort)cdef_pri_taps[(int)uVar242][1];
      auVar247 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,2);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,3);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,4);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,5);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,6);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,7);
      auVar14 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar14 = vpinsrw_avx(auVar14,(uint)uVar2,2);
      auVar14 = vpinsrw_avx(auVar14,(uint)uVar2,3);
      auVar14 = vpinsrw_avx(auVar14,(uint)uVar2,4);
      auVar14 = vpinsrw_avx(auVar14,(uint)uVar2,5);
      auVar14 = vpinsrw_avx(auVar14,(uint)uVar2,6);
      auVar14 = vpinsrw_avx(auVar14,(uint)uVar2,7);
      auVar248 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar247;
      uStack_1f0 = auVar248._0_8_;
      uStack_1e8 = auVar248._8_8_;
      auVar101._8_8_ = uStack_7238 ^ uStack_cb78;
      auVar101._0_8_ = local_7240 ^ local_cb80;
      auVar101._16_8_ = uStack_7230 ^ uStack_cb70;
      auVar101._24_8_ = uStack_7228 ^ uStack_cb68;
      auVar100._8_8_ = uStack_71f8 ^ uStack_cc58;
      auVar100._0_8_ = local_7200 ^ local_cc60;
      auVar100._16_8_ = uStack_71f0 ^ uStack_cc50;
      auVar100._24_8_ = uStack_71e8 ^ uStack_cc48;
      auVar21 = vpaddw_avx2(auVar101,auVar100);
      auVar119._16_8_ = uStack_1f0;
      auVar119._0_16_ = ZEXT116(0) * auVar247 + ZEXT116(1) * auVar14;
      auVar119._24_8_ = uStack_1e8;
      auVar21 = vpmullw_avx2(auVar119,auVar21);
      auVar17 = vpaddw_avx2(auVar17,auVar21);
      auVar217._16_8_ = local_d8e0;
      auVar217._0_16_ = auVar9;
      auVar217._24_8_ = uStack_d8d8;
      auVar128._16_8_ = uStack_e090;
      auVar128._0_16_ = auVar244;
      auVar128._24_8_ = uStack_e088;
      auVar21 = vpand_avx2(auVar217,auVar128);
      auVar175._16_8_ = uStack_e050;
      auVar175._0_16_ = auVar245;
      auVar175._24_8_ = uStack_e048;
      auVar18 = vpmaxsw_avx2(auVar175,auVar21);
      auVar219._16_8_ = local_d910;
      auVar219._0_16_ = auVar250;
      auVar219._24_8_ = uStack_d908;
      auVar129._16_8_ = uStack_e090;
      auVar129._0_16_ = auVar244;
      auVar129._24_8_ = uStack_e088;
      auVar21 = vpand_avx2(auVar219,auVar129);
      auVar18 = vpmaxsw_avx2(auVar18,auVar21);
      auVar221._16_8_ = local_d940;
      auVar221._0_16_ = auVar13;
      auVar221._24_8_ = uStack_d938;
      auVar130._16_8_ = uStack_e090;
      auVar130._0_16_ = auVar244;
      auVar130._24_8_ = uStack_e088;
      auVar21 = vpand_avx2(auVar221,auVar130);
      auVar18 = vpmaxsw_avx2(auVar18,auVar21);
      auVar223._16_8_ = local_d970;
      auVar223._0_16_ = auVar10;
      auVar223._24_8_ = uStack_d968;
      auVar131._16_8_ = uStack_e090;
      auVar131._0_16_ = auVar244;
      auVar131._24_8_ = uStack_e088;
      auVar21 = vpand_avx2(auVar223,auVar131);
      auVar19 = vpmaxsw_avx2(auVar18,auVar21);
      auVar157._16_8_ = uStack_e050;
      auVar157._0_16_ = auVar245;
      auVar157._24_8_ = uStack_e048;
      auVar156._16_8_ = local_d8e0;
      auVar156._0_16_ = auVar9;
      auVar156._24_8_ = uStack_d8d8;
      auVar21 = vpminsw_avx2(auVar157,auVar156);
      auVar158._16_8_ = local_d910;
      auVar158._0_16_ = auVar250;
      auVar158._24_8_ = uStack_d908;
      auVar21 = vpminsw_avx2(auVar21,auVar158);
      auVar159._16_8_ = local_d940;
      auVar159._0_16_ = auVar13;
      auVar159._24_8_ = uStack_d938;
      auVar21 = vpminsw_avx2(auVar21,auVar159);
      auVar160._16_8_ = local_d970;
      auVar160._0_16_ = auVar10;
      auVar160._24_8_ = uStack_d968;
      auVar16 = vpminsw_avx2(auVar21,auVar160);
      auVar247 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar5) * 2));
      auVar9 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar5) * 2));
      local_d760 = auVar247._0_8_;
      uStack_d758 = auVar247._8_8_;
      auVar247 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar5) * 2));
      auVar250 = vlddqu_avx(*(undefined1 (*) [16])
                             (in_RDX + (long)((local_df90 * 0x90 - iVar5) + 0x90) * 2));
      local_d790 = auVar247._0_8_;
      uStack_d788 = auVar247._8_8_;
      auVar247 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar7) * 2));
      auVar13 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar7) * 2));
      local_d7c0 = auVar247._0_8_;
      uStack_d7b8 = auVar247._8_8_;
      auVar247 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar7) * 2));
      auVar10 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)((local_df90 * 0x90 - iVar7) + 0x90) * 2));
      local_d7f0 = auVar247._0_8_;
      uStack_d7e8 = auVar247._8_8_;
      auVar23._16_8_ = local_d760;
      auVar23._0_16_ = auVar9;
      auVar23._24_8_ = uStack_d758;
      auVar22._16_8_ = uStack_e050;
      auVar22._0_16_ = auVar245;
      auVar22._24_8_ = uStack_e048;
      auVar21 = vpsubw_avx2(auVar23,auVar22);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar14 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,2);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,3);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,4);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,5);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,6);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,7);
      uStack_930 = auVar14._0_8_;
      uStack_928 = auVar14._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_df64));
      auVar87._16_8_ = uStack_930;
      auVar87._0_16_ = auVar247;
      auVar87._24_8_ = uStack_928;
      auVar20 = vpsubusw_avx2(auVar87,auVar20);
      local_c2c0 = auVar18._0_8_;
      uStack_c2b8 = auVar18._8_8_;
      uStack_c2b0 = auVar18._16_8_;
      uStack_c2a8 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_74c0 = auVar21._0_8_;
      uStack_74b8 = auVar21._8_8_;
      uStack_74b0 = auVar21._16_8_;
      uStack_74a8 = auVar21._24_8_;
      auVar25._16_8_ = local_d790;
      auVar25._0_16_ = auVar250;
      auVar25._24_8_ = uStack_d788;
      auVar24._16_8_ = uStack_e050;
      auVar24._0_16_ = auVar245;
      auVar24._24_8_ = uStack_e048;
      auVar21 = vpsubw_avx2(auVar25,auVar24);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar14 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,2);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,3);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,4);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,5);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,6);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,7);
      uStack_8f0 = auVar14._0_8_;
      uStack_8e8 = auVar14._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_df64));
      auVar86._16_8_ = uStack_8f0;
      auVar86._0_16_ = auVar247;
      auVar86._24_8_ = uStack_8e8;
      auVar20 = vpsubusw_avx2(auVar86,auVar20);
      local_c3a0 = auVar18._0_8_;
      uStack_c398 = auVar18._8_8_;
      uStack_c390 = auVar18._16_8_;
      uStack_c388 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7480 = auVar21._0_8_;
      uStack_7478 = auVar21._8_8_;
      uStack_7470 = auVar21._16_8_;
      uStack_7468 = auVar21._24_8_;
      auVar27._16_8_ = local_d7c0;
      auVar27._0_16_ = auVar13;
      auVar27._24_8_ = uStack_d7b8;
      auVar26._16_8_ = uStack_e050;
      auVar26._0_16_ = auVar245;
      auVar26._24_8_ = uStack_e048;
      auVar21 = vpsubw_avx2(auVar27,auVar26);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar14 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,2);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,3);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,4);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,5);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,6);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,7);
      uStack_8b0 = auVar14._0_8_;
      uStack_8a8 = auVar14._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_df64));
      auVar85._16_8_ = uStack_8b0;
      auVar85._0_16_ = auVar247;
      auVar85._24_8_ = uStack_8a8;
      auVar20 = vpsubusw_avx2(auVar85,auVar20);
      local_c480 = auVar18._0_8_;
      uStack_c478 = auVar18._8_8_;
      uStack_c470 = auVar18._16_8_;
      uStack_c468 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7440 = auVar21._0_8_;
      uStack_7438 = auVar21._8_8_;
      uStack_7430 = auVar21._16_8_;
      uStack_7428 = auVar21._24_8_;
      auVar29._16_8_ = local_d7f0;
      auVar29._0_16_ = auVar10;
      auVar29._24_8_ = uStack_d7e8;
      auVar28._16_8_ = uStack_e050;
      auVar28._0_16_ = auVar245;
      auVar28._24_8_ = uStack_e048;
      auVar21 = vpsubw_avx2(auVar29,auVar28);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar14 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,2);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,3);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,4);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,5);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,6);
      auVar14 = vpinsrw_avx(auVar14,in_R8D & 0xffff,7);
      uStack_870 = auVar14._0_8_;
      uStack_868 = auVar14._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_df64));
      auVar84._16_8_ = uStack_870;
      auVar84._0_16_ = auVar247;
      auVar84._24_8_ = uStack_868;
      auVar20 = vpsubusw_avx2(auVar84,auVar20);
      local_c560 = auVar18._0_8_;
      uStack_c558 = auVar18._8_8_;
      uStack_c550 = auVar18._16_8_;
      uStack_c548 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7400 = auVar21._0_8_;
      uStack_73f8 = auVar21._8_8_;
      uStack_73f0 = auVar21._16_8_;
      uStack_73e8 = auVar21._24_8_;
      auVar247 = vpinsrw_avx(ZEXT216(2),2,1);
      auVar247 = vpinsrw_avx(auVar247,2,2);
      auVar247 = vpinsrw_avx(auVar247,2,3);
      auVar247 = vpinsrw_avx(auVar247,2,4);
      auVar247 = vpinsrw_avx(auVar247,2,5);
      auVar247 = vpinsrw_avx(auVar247,2,6);
      auVar247 = vpinsrw_avx(auVar247,2,7);
      auVar14 = vpinsrw_avx(ZEXT216(2),2,1);
      auVar14 = vpinsrw_avx(auVar14,2,2);
      auVar14 = vpinsrw_avx(auVar14,2,3);
      auVar14 = vpinsrw_avx(auVar14,2,4);
      auVar14 = vpinsrw_avx(auVar14,2,5);
      auVar14 = vpinsrw_avx(auVar14,2,6);
      auVar14 = vpinsrw_avx(auVar14,2,7);
      uStack_2b0 = auVar14._0_8_;
      uStack_2a8 = auVar14._8_8_;
      auVar91._8_8_ = uStack_74b8 ^ uStack_c2b8;
      auVar91._0_8_ = local_74c0 ^ local_c2c0;
      auVar91._16_8_ = uStack_74b0 ^ uStack_c2b0;
      auVar91._24_8_ = uStack_74a8 ^ uStack_c2a8;
      auVar90._8_8_ = uStack_7478 ^ uStack_c398;
      auVar90._0_8_ = local_7480 ^ local_c3a0;
      auVar90._16_8_ = uStack_7470 ^ uStack_c390;
      auVar90._24_8_ = uStack_7468 ^ uStack_c388;
      auVar21 = vpaddw_avx2(auVar91,auVar90);
      auVar93._8_8_ = uStack_7438 ^ uStack_c478;
      auVar93._0_8_ = local_7440 ^ local_c480;
      auVar93._16_8_ = uStack_7430 ^ uStack_c470;
      auVar93._24_8_ = uStack_7428 ^ uStack_c468;
      auVar92._8_8_ = uStack_73f8 ^ uStack_c558;
      auVar92._0_8_ = local_7400 ^ local_c560;
      auVar92._16_8_ = uStack_73f0 ^ uStack_c550;
      auVar92._24_8_ = uStack_73e8 ^ uStack_c548;
      auVar18 = vpaddw_avx2(auVar93,auVar92);
      auVar21 = vpaddw_avx2(auVar21,auVar18);
      auVar116._16_8_ = uStack_2b0;
      auVar116._0_16_ = auVar247;
      auVar116._24_8_ = uStack_2a8;
      auVar21 = vpmullw_avx2(auVar116,auVar21);
      auVar17 = vpaddw_avx2(auVar17,auVar21);
      auVar247 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar6) * 2));
      auVar14 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar6) * 2));
      local_d820 = auVar247._0_8_;
      uStack_d818 = auVar247._8_8_;
      auVar247 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar6) * 2));
      auVar248 = vlddqu_avx(*(undefined1 (*) [16])
                             (in_RDX + (long)((local_df90 * 0x90 - iVar6) + 0x90) * 2));
      local_d850 = auVar247._0_8_;
      uStack_d848 = auVar247._8_8_;
      auVar247 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar8) * 2));
      auVar11 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar8) * 2));
      local_d880 = auVar247._0_8_;
      uStack_d878 = auVar247._8_8_;
      auVar247 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar8) * 2));
      auVar12 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)((local_df90 * 0x90 - iVar8) + 0x90) * 2));
      local_d8b0 = auVar247._0_8_;
      uStack_d8a8 = auVar247._8_8_;
      auVar31._16_8_ = local_d820;
      auVar31._0_16_ = auVar14;
      auVar31._24_8_ = uStack_d818;
      auVar30._16_8_ = uStack_e050;
      auVar30._0_16_ = auVar245;
      auVar30._24_8_ = uStack_e048;
      auVar21 = vpsubw_avx2(auVar31,auVar30);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar15 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,2);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,3);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,4);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,5);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,6);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,7);
      uStack_830 = auVar15._0_8_;
      uStack_828 = auVar15._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_df64));
      auVar83._16_8_ = uStack_830;
      auVar83._0_16_ = auVar247;
      auVar83._24_8_ = uStack_828;
      auVar20 = vpsubusw_avx2(auVar83,auVar20);
      local_c640 = auVar18._0_8_;
      uStack_c638 = auVar18._8_8_;
      uStack_c630 = auVar18._16_8_;
      uStack_c628 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_73c0 = auVar21._0_8_;
      uStack_73b8 = auVar21._8_8_;
      uStack_73b0 = auVar21._16_8_;
      uStack_73a8 = auVar21._24_8_;
      auVar33._16_8_ = local_d850;
      auVar33._0_16_ = auVar248;
      auVar33._24_8_ = uStack_d848;
      auVar32._16_8_ = uStack_e050;
      auVar32._0_16_ = auVar245;
      auVar32._24_8_ = uStack_e048;
      auVar21 = vpsubw_avx2(auVar33,auVar32);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar15 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,2);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,3);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,4);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,5);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,6);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,7);
      uStack_7f0 = auVar15._0_8_;
      uStack_7e8 = auVar15._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_df64));
      auVar82._16_8_ = uStack_7f0;
      auVar82._0_16_ = auVar247;
      auVar82._24_8_ = uStack_7e8;
      auVar20 = vpsubusw_avx2(auVar82,auVar20);
      local_c720 = auVar18._0_8_;
      uStack_c718 = auVar18._8_8_;
      uStack_c710 = auVar18._16_8_;
      uStack_c708 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7380 = auVar21._0_8_;
      uStack_7378 = auVar21._8_8_;
      uStack_7370 = auVar21._16_8_;
      uStack_7368 = auVar21._24_8_;
      auVar35._16_8_ = local_d880;
      auVar35._0_16_ = auVar11;
      auVar35._24_8_ = uStack_d878;
      auVar34._16_8_ = uStack_e050;
      auVar34._0_16_ = auVar245;
      auVar34._24_8_ = uStack_e048;
      auVar21 = vpsubw_avx2(auVar35,auVar34);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar15 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,2);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,3);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,4);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,5);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,6);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,7);
      uStack_7b0 = auVar15._0_8_;
      uStack_7a8 = auVar15._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_df64));
      auVar81._16_8_ = uStack_7b0;
      auVar81._0_16_ = auVar247;
      auVar81._24_8_ = uStack_7a8;
      auVar20 = vpsubusw_avx2(auVar81,auVar20);
      local_c800 = auVar18._0_8_;
      uStack_c7f8 = auVar18._8_8_;
      uStack_c7f0 = auVar18._16_8_;
      uStack_c7e8 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7340 = auVar21._0_8_;
      uStack_7338 = auVar21._8_8_;
      uStack_7330 = auVar21._16_8_;
      uStack_7328 = auVar21._24_8_;
      auVar37._16_8_ = local_d8b0;
      auVar37._0_16_ = auVar12;
      auVar37._24_8_ = uStack_d8a8;
      auVar36._16_8_ = uStack_e050;
      auVar36._0_16_ = auVar245;
      auVar36._24_8_ = uStack_e048;
      auVar21 = vpsubw_avx2(auVar37,auVar36);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar15 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,2);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,3);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,4);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,5);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,6);
      auVar15 = vpinsrw_avx(auVar15,in_R8D & 0xffff,7);
      uStack_770 = auVar15._0_8_;
      uStack_768 = auVar15._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_df64));
      auVar80._16_8_ = uStack_770;
      auVar80._0_16_ = auVar247;
      auVar80._24_8_ = uStack_768;
      auVar20 = vpsubusw_avx2(auVar80,auVar20);
      local_c8e0 = auVar18._0_8_;
      uStack_c8d8 = auVar18._8_8_;
      uStack_c8d0 = auVar18._16_8_;
      uStack_c8c8 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7300 = auVar21._0_8_;
      uStack_72f8 = auVar21._8_8_;
      uStack_72f0 = auVar21._16_8_;
      uStack_72e8 = auVar21._24_8_;
      auVar247 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar247 = vpinsrw_avx(auVar247,1,2);
      auVar247 = vpinsrw_avx(auVar247,1,3);
      auVar247 = vpinsrw_avx(auVar247,1,4);
      auVar247 = vpinsrw_avx(auVar247,1,5);
      auVar247 = vpinsrw_avx(auVar247,1,6);
      auVar247 = vpinsrw_avx(auVar247,1,7);
      auVar15 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar15 = vpinsrw_avx(auVar15,1,2);
      auVar15 = vpinsrw_avx(auVar15,1,3);
      auVar15 = vpinsrw_avx(auVar15,1,4);
      auVar15 = vpinsrw_avx(auVar15,1,5);
      auVar15 = vpinsrw_avx(auVar15,1,6);
      auVar15 = vpinsrw_avx(auVar15,1,7);
      auVar249 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar247;
      uStack_270 = auVar249._0_8_;
      uStack_268 = auVar249._8_8_;
      auVar95._8_8_ = uStack_73b8 ^ uStack_c638;
      auVar95._0_8_ = local_73c0 ^ local_c640;
      auVar95._16_8_ = uStack_73b0 ^ uStack_c630;
      auVar95._24_8_ = uStack_73a8 ^ uStack_c628;
      auVar94._8_8_ = uStack_7378 ^ uStack_c718;
      auVar94._0_8_ = local_7380 ^ local_c720;
      auVar94._16_8_ = uStack_7370 ^ uStack_c710;
      auVar94._24_8_ = uStack_7368 ^ uStack_c708;
      auVar21 = vpaddw_avx2(auVar95,auVar94);
      auVar97._8_8_ = uStack_7338 ^ uStack_c7f8;
      auVar97._0_8_ = local_7340 ^ local_c800;
      auVar97._16_8_ = uStack_7330 ^ uStack_c7f0;
      auVar97._24_8_ = uStack_7328 ^ uStack_c7e8;
      auVar96._8_8_ = uStack_72f8 ^ uStack_c8d8;
      auVar96._0_8_ = local_7300 ^ local_c8e0;
      auVar96._16_8_ = uStack_72f0 ^ uStack_c8d0;
      auVar96._24_8_ = uStack_72e8 ^ uStack_c8c8;
      auVar18 = vpaddw_avx2(auVar97,auVar96);
      auVar21 = vpaddw_avx2(auVar21,auVar18);
      auVar117._16_8_ = uStack_270;
      auVar117._0_16_ = ZEXT116(0) * auVar247 + ZEXT116(1) * auVar15;
      auVar117._24_8_ = uStack_268;
      auVar21 = vpmullw_avx2(auVar117,auVar21);
      auVar21 = vpaddw_avx2(auVar17,auVar21);
      auVar218._16_8_ = local_d760;
      auVar218._0_16_ = auVar9;
      auVar218._24_8_ = uStack_d758;
      auVar140._16_8_ = uStack_e090;
      auVar140._0_16_ = auVar244;
      auVar140._24_8_ = uStack_e088;
      auVar17 = vpand_avx2(auVar218,auVar140);
      auVar18 = vpmaxsw_avx2(auVar19,auVar17);
      auVar220._16_8_ = local_d790;
      auVar220._0_16_ = auVar250;
      auVar220._24_8_ = uStack_d788;
      auVar141._16_8_ = uStack_e090;
      auVar141._0_16_ = auVar244;
      auVar141._24_8_ = uStack_e088;
      auVar17 = vpand_avx2(auVar220,auVar141);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar222._16_8_ = local_d7c0;
      auVar222._0_16_ = auVar13;
      auVar222._24_8_ = uStack_d7b8;
      auVar142._16_8_ = uStack_e090;
      auVar142._0_16_ = auVar244;
      auVar142._24_8_ = uStack_e088;
      auVar17 = vpand_avx2(auVar222,auVar142);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar224._16_8_ = local_d7f0;
      auVar224._0_16_ = auVar10;
      auVar224._24_8_ = uStack_d7e8;
      auVar143._16_8_ = uStack_e090;
      auVar143._0_16_ = auVar244;
      auVar143._24_8_ = uStack_e088;
      auVar17 = vpand_avx2(auVar224,auVar143);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar225._16_8_ = local_d820;
      auVar225._0_16_ = auVar14;
      auVar225._24_8_ = uStack_d818;
      auVar144._16_8_ = uStack_e090;
      auVar144._0_16_ = auVar244;
      auVar144._24_8_ = uStack_e088;
      auVar17 = vpand_avx2(auVar225,auVar144);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar226._16_8_ = local_d850;
      auVar226._0_16_ = auVar248;
      auVar226._24_8_ = uStack_d848;
      auVar145._16_8_ = uStack_e090;
      auVar145._0_16_ = auVar244;
      auVar145._24_8_ = uStack_e088;
      auVar17 = vpand_avx2(auVar226,auVar145);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar227._16_8_ = local_d880;
      auVar227._0_16_ = auVar11;
      auVar227._24_8_ = uStack_d878;
      auVar146._16_8_ = uStack_e090;
      auVar146._0_16_ = auVar244;
      auVar146._24_8_ = uStack_e088;
      auVar17 = vpand_avx2(auVar227,auVar146);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar228._16_8_ = local_d8b0;
      auVar228._0_16_ = auVar12;
      auVar228._24_8_ = uStack_d8a8;
      auVar147._16_8_ = uStack_e090;
      auVar147._0_16_ = auVar244;
      auVar147._24_8_ = uStack_e088;
      auVar17 = vpand_avx2(auVar228,auVar147);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar148._16_8_ = local_d760;
      auVar148._0_16_ = auVar9;
      auVar148._24_8_ = uStack_d758;
      auVar17 = vpminsw_avx2(auVar16,auVar148);
      auVar149._16_8_ = local_d790;
      auVar149._0_16_ = auVar250;
      auVar149._24_8_ = uStack_d788;
      auVar17 = vpminsw_avx2(auVar17,auVar149);
      auVar150._16_8_ = local_d7c0;
      auVar150._0_16_ = auVar13;
      auVar150._24_8_ = uStack_d7b8;
      auVar17 = vpminsw_avx2(auVar17,auVar150);
      auVar151._16_8_ = local_d7f0;
      auVar151._0_16_ = auVar10;
      auVar151._24_8_ = uStack_d7e8;
      auVar17 = vpminsw_avx2(auVar17,auVar151);
      auVar152._16_8_ = local_d820;
      auVar152._0_16_ = auVar14;
      auVar152._24_8_ = uStack_d818;
      auVar17 = vpminsw_avx2(auVar17,auVar152);
      auVar153._16_8_ = local_d850;
      auVar153._0_16_ = auVar248;
      auVar153._24_8_ = uStack_d848;
      auVar17 = vpminsw_avx2(auVar17,auVar153);
      auVar154._16_8_ = local_d880;
      auVar154._0_16_ = auVar11;
      auVar154._24_8_ = uStack_d878;
      auVar17 = vpminsw_avx2(auVar17,auVar154);
      auVar155._16_8_ = local_d8b0;
      auVar155._0_16_ = auVar12;
      auVar155._24_8_ = uStack_d8a8;
      auVar19 = vpminsw_avx2(auVar17,auVar155);
      uStack_9078 = SUB328(ZEXT832(0),4);
      auVar17 = vpcmpgtw_avx2(ZEXT832(uStack_9078) << 0x40,auVar21);
      auVar21 = vpaddw_avx2(auVar21,auVar17);
      auVar247 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar247 = vpinsrw_avx(auVar247,8,2);
      auVar247 = vpinsrw_avx(auVar247,8,3);
      auVar247 = vpinsrw_avx(auVar247,8,4);
      auVar247 = vpinsrw_avx(auVar247,8,5);
      auVar247 = vpinsrw_avx(auVar247,8,6);
      auVar247 = vpinsrw_avx(auVar247,8,7);
      auVar9 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar9 = vpinsrw_avx(auVar9,8,2);
      auVar9 = vpinsrw_avx(auVar9,8,3);
      auVar9 = vpinsrw_avx(auVar9,8,4);
      auVar9 = vpinsrw_avx(auVar9,8,5);
      auVar9 = vpinsrw_avx(auVar9,8,6);
      auVar9 = vpinsrw_avx(auVar9,8,7);
      auVar250 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar247;
      uStack_2f0 = auVar250._0_8_;
      uStack_2e8 = auVar250._8_8_;
      auVar88._16_8_ = uStack_2f0;
      auVar88._0_16_ = ZEXT116(0) * auVar247 + ZEXT116(1) * auVar9;
      auVar88._24_8_ = uStack_2e8;
      auVar21 = vpaddw_avx2(auVar21,auVar88);
      auVar21 = vpsraw_avx2(auVar21,ZEXT416(4));
      auVar89._16_8_ = uStack_e050;
      auVar89._0_16_ = auVar245;
      auVar89._24_8_ = uStack_e048;
      auVar21 = vpaddw_avx2(auVar89,auVar21);
      auVar21 = vpmaxsw_avx2(auVar21,auVar19);
      auVar21 = vpminsw_avx2(auVar21,auVar18);
      local_e080 = auVar21._0_8_;
      uStack_e078 = auVar21._8_8_;
      puStack_e068 = auVar21._24_8_;
      *puStack_e068 = local_dad0;
      puStack_e068[1] = uStack_dac8;
      puVar1 = (undefined8 *)(in_RDI + (long)((local_df90 + 1) * in_ESI) * 2);
      *puVar1 = local_e080;
      puVar1[1] = uStack_e078;
    }
  }
  else {
    local_db20 = in_stack_00000008;
    local_db24 = pri_damping;
    auVar247 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar247 = vpinsrw_avx(auVar247,0xbfff,2);
    auVar247 = vpinsrw_avx(auVar247,0xbfff,3);
    auVar247 = vpinsrw_avx(auVar247,0xbfff,4);
    auVar247 = vpinsrw_avx(auVar247,0xbfff,5);
    auVar247 = vpinsrw_avx(auVar247,0xbfff,6);
    auVar247 = vpinsrw_avx(auVar247,0xbfff,7);
    auVar244 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar244 = vpinsrw_avx(auVar244,0xbfff,2);
    auVar244 = vpinsrw_avx(auVar244,0xbfff,3);
    auVar244 = vpinsrw_avx(auVar244,0xbfff,4);
    auVar244 = vpinsrw_avx(auVar244,0xbfff,5);
    auVar244 = vpinsrw_avx(auVar244,0xbfff,6);
    auVar244 = vpinsrw_avx(auVar244,0xbfff,7);
    auVar244 = ZEXT116(0) * auVar247 + ZEXT116(1) * auVar244;
    auVar247 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar247;
    iVar3 = cdef_directions_padded[(long)in_R9D + 2][0];
    iVar4 = cdef_directions_padded[(long)in_R9D + 2][1];
    iVar5 = cdef_directions_padded[(long)(in_R9D + 2) + 2][0];
    iVar6 = cdef_directions_padded[(long)(in_R9D + 2) + 2][1];
    iVar7 = cdef_directions_padded[(long)(in_R9D + -2) + 2][0];
    iVar8 = cdef_directions_padded[(long)(in_R9D + -2) + 2][1];
    uVar242 = (int)in_ECX >> ((byte)sec_damping & 0x1f) & 1;
    if (in_ECX != 0) {
      iVar243 = get_msb(in_ECX);
      if ((int)(in_stack_00000008 - iVar243) < 0) {
        local_e2a0 = 0;
      }
      else {
        iVar243 = get_msb(in_ECX);
        local_e2a0 = in_stack_00000008 - iVar243;
      }
      local_db20 = local_e2a0;
    }
    if (in_R8D != 0) {
      iVar243 = get_msb(in_R8D);
      if (pri_damping - iVar243 < 0) {
        local_e2ac = 0;
      }
      else {
        iVar243 = get_msb(in_R8D);
        local_e2ac = pri_damping - iVar243;
      }
      local_db24 = local_e2ac;
    }
    uStack_dc88 = auVar247._8_8_;
    uStack_dc90 = auVar247._0_8_;
    for (local_dccc = 0; local_dccc < block_width; local_dccc = local_dccc + 4) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90) * 2);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90) * 2);
      auVar247 = vpunpcklqdq_avx(auVar10,auVar13);
      auVar250._8_8_ = 0;
      auVar250._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0) * 2);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120) * 2);
      auVar9 = vpunpcklqdq_avx(auVar250,auVar9);
      auVar246 = ZEXT116(0) * auVar247 + ZEXT116(1) * auVar9;
      auVar247 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar247;
      uStack_dc10 = auVar247._0_8_;
      uStack_dc08 = auVar247._8_8_;
      auVar204._8_8_ = 0;
      auVar204._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar3) * 2);
      auVar203._8_8_ = 0;
      auVar203._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar3) * 2);
      auVar247 = vpunpcklqdq_avx(auVar204,auVar203);
      auVar202._8_8_ = 0;
      auVar202._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar3) * 2);
      auVar201._8_8_ = 0;
      auVar201._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar3) * 2);
      auVar250 = vpunpcklqdq_avx(auVar202,auVar201);
      local_1b60 = auVar247._0_8_;
      uStack_1b58 = auVar247._8_8_;
      auVar19._16_8_ = local_1b60;
      auVar19._0_16_ = auVar250;
      auVar19._24_8_ = uStack_1b58;
      auVar17._16_8_ = uStack_dc10;
      auVar17._0_16_ = auVar246;
      auVar17._24_8_ = uStack_dc08;
      auVar21 = vpsubw_avx2(auVar19,auVar17);
      auVar17 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,7);
      auVar9 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,2);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,3);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,4);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,5);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,6);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,7);
      uStack_430 = auVar9._0_8_;
      uStack_428 = auVar9._8_8_;
      auVar18 = vpsrlw_avx2(auVar21,ZEXT416(local_db20));
      auVar67._16_8_ = uStack_430;
      auVar67._0_16_ = auVar247;
      auVar67._24_8_ = uStack_428;
      auVar18 = vpsubusw_avx2(auVar67,auVar18);
      local_d440 = auVar17._0_8_;
      uStack_d438 = auVar17._8_8_;
      uStack_d430 = auVar17._16_8_;
      uStack_d428 = auVar17._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar18);
      auVar21 = vpaddw_avx2(auVar17,auVar21);
      local_6fc0 = auVar21._0_8_;
      uStack_6fb8 = auVar21._8_8_;
      uStack_6fb0 = auVar21._16_8_;
      uStack_6fa8 = auVar21._24_8_;
      auVar208._8_8_ = 0;
      auVar208._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x90) * 2);
      auVar207._8_8_ = 0;
      auVar207._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar3) * 2);
      auVar247 = vpunpcklqdq_avx(auVar208,auVar207);
      auVar206._8_8_ = 0;
      auVar206._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x1b0) * 2);
      auVar205._8_8_ = 0;
      auVar205._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x120) * 2);
      auVar13 = vpunpcklqdq_avx(auVar206,auVar205);
      local_1bd0 = auVar247._0_8_;
      uStack_1bc8 = auVar247._8_8_;
      auVar59._16_8_ = local_1bd0;
      auVar59._0_16_ = auVar13;
      auVar59._24_8_ = uStack_1bc8;
      auVar16._16_8_ = uStack_dc10;
      auVar16._0_16_ = auVar246;
      auVar16._24_8_ = uStack_dc08;
      auVar21 = vpsubw_avx2(auVar59,auVar16);
      auVar17 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,7);
      auVar9 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,2);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,3);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,4);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,5);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,6);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,7);
      uStack_3f0 = auVar9._0_8_;
      uStack_3e8 = auVar9._8_8_;
      auVar18 = vpsrlw_avx2(auVar21,ZEXT416(local_db20));
      auVar66._16_8_ = uStack_3f0;
      auVar66._0_16_ = auVar247;
      auVar66._24_8_ = uStack_3e8;
      auVar18 = vpsubusw_avx2(auVar66,auVar18);
      local_d520 = auVar17._0_8_;
      uStack_d518 = auVar17._8_8_;
      uStack_d510 = auVar17._16_8_;
      uStack_d508 = auVar17._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar18);
      auVar21 = vpaddw_avx2(auVar17,auVar21);
      local_6f80 = auVar21._0_8_;
      uStack_6f78 = auVar21._8_8_;
      uStack_6f70 = auVar21._16_8_;
      uStack_6f68 = auVar21._24_8_;
      uVar2 = (ushort)cdef_pri_taps[(int)uVar242][0];
      auVar247 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,2);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,3);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,4);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,5);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,6);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,7);
      auVar9 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,2);
      auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,3);
      auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,4);
      auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,5);
      auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,6);
      auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,7);
      uStack_b0 = auVar9._0_8_;
      uStack_a8 = auVar9._8_8_;
      auVar113._8_8_ = uStack_6fb8 ^ uStack_d438;
      auVar113._0_8_ = local_6fc0 ^ local_d440;
      auVar113._16_8_ = uStack_6fb0 ^ uStack_d430;
      auVar113._24_8_ = uStack_6fa8 ^ uStack_d428;
      auVar112._8_8_ = uStack_6f78 ^ uStack_d518;
      auVar112._0_8_ = local_6f80 ^ local_d520;
      auVar112._16_8_ = uStack_6f70 ^ uStack_d510;
      auVar112._24_8_ = uStack_6f68 ^ uStack_d508;
      auVar21 = vpaddw_avx2(auVar113,auVar112);
      auVar122._16_8_ = uStack_b0;
      auVar122._0_16_ = auVar247;
      auVar122._24_8_ = uStack_a8;
      auVar21 = vpmullw_avx2(auVar122,auVar21);
      auVar17 = vpaddw_avx2(ZEXT1632(ZEXT816(0)),auVar21);
      auVar212._8_8_ = 0;
      auVar212._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar4) * 2);
      auVar211._8_8_ = 0;
      auVar211._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar4) * 2);
      auVar247 = vpunpcklqdq_avx(auVar212,auVar211);
      auVar210._8_8_ = 0;
      auVar210._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar4) * 2);
      auVar209._8_8_ = 0;
      auVar209._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar4) * 2);
      auVar10 = vpunpcklqdq_avx(auVar210,auVar209);
      local_1c40 = auVar247._0_8_;
      uStack_1c38 = auVar247._8_8_;
      auVar61._16_8_ = local_1c40;
      auVar61._0_16_ = auVar10;
      auVar61._24_8_ = uStack_1c38;
      auVar60._16_8_ = uStack_dc10;
      auVar60._0_16_ = auVar246;
      auVar60._24_8_ = uStack_dc08;
      auVar21 = vpsubw_avx2(auVar61,auVar60);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,7);
      auVar9 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,2);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,3);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,4);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,5);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,6);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,7);
      uStack_3b0 = auVar9._0_8_;
      uStack_3a8 = auVar9._8_8_;
      auVar19 = vpsrlw_avx2(auVar21,ZEXT416(local_db20));
      auVar65._16_8_ = uStack_3b0;
      auVar65._0_16_ = auVar247;
      auVar65._24_8_ = uStack_3a8;
      auVar19 = vpsubusw_avx2(auVar65,auVar19);
      local_d600 = auVar18._0_8_;
      uStack_d5f8 = auVar18._8_8_;
      uStack_d5f0 = auVar18._16_8_;
      uStack_d5e8 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar19);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_6f40 = auVar21._0_8_;
      uStack_6f38 = auVar21._8_8_;
      uStack_6f30 = auVar21._16_8_;
      uStack_6f28 = auVar21._24_8_;
      auVar216._8_8_ = 0;
      auVar216._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar4) + 0x90) * 2);
      auVar215._8_8_ = 0;
      auVar215._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar4) * 2);
      auVar247 = vpunpcklqdq_avx(auVar216,auVar215);
      auVar214._8_8_ = 0;
      auVar214._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar4) + 0x1b0) * 2);
      auVar213._8_8_ = 0;
      auVar213._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar4) + 0x120) * 2);
      auVar14 = vpunpcklqdq_avx(auVar214,auVar213);
      local_1cb0 = auVar247._0_8_;
      uStack_1ca8 = auVar247._8_8_;
      auVar63._16_8_ = local_1cb0;
      auVar63._0_16_ = auVar14;
      auVar63._24_8_ = uStack_1ca8;
      auVar62._16_8_ = uStack_dc10;
      auVar62._0_16_ = auVar246;
      auVar62._24_8_ = uStack_dc08;
      auVar21 = vpsubw_avx2(auVar63,auVar62);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_ECX & 0xffff,7);
      auVar9 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,2);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,3);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,4);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,5);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,6);
      auVar9 = vpinsrw_avx(auVar9,in_ECX & 0xffff,7);
      uStack_370 = auVar9._0_8_;
      uStack_368 = auVar9._8_8_;
      auVar19 = vpsrlw_avx2(auVar21,ZEXT416(local_db20));
      auVar64._16_8_ = uStack_370;
      auVar64._0_16_ = auVar247;
      auVar64._24_8_ = uStack_368;
      auVar19 = vpsubusw_avx2(auVar64,auVar19);
      local_d6e0 = auVar18._0_8_;
      uStack_d6d8 = auVar18._8_8_;
      uStack_d6d0 = auVar18._16_8_;
      uStack_d6c8 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar19);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_6f00 = auVar21._0_8_;
      uStack_6ef8 = auVar21._8_8_;
      uStack_6ef0 = auVar21._16_8_;
      uStack_6ee8 = auVar21._24_8_;
      uVar2 = (ushort)cdef_pri_taps[(int)uVar242][1];
      auVar247 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,2);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,3);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,4);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,5);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,6);
      auVar247 = vpinsrw_avx(auVar247,(uint)uVar2,7);
      auVar9 = vpinsrw_avx(ZEXT216(uVar2),(uint)uVar2,1);
      auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,2);
      auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,3);
      auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,4);
      auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,5);
      auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,6);
      auVar9 = vpinsrw_avx(auVar9,(uint)uVar2,7);
      auVar248 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar247;
      uStack_70 = auVar248._0_8_;
      uStack_68 = auVar248._8_8_;
      auVar115._8_8_ = uStack_6f38 ^ uStack_d5f8;
      auVar115._0_8_ = local_6f40 ^ local_d600;
      auVar115._16_8_ = uStack_6f30 ^ uStack_d5f0;
      auVar115._24_8_ = uStack_6f28 ^ uStack_d5e8;
      auVar114._8_8_ = uStack_6ef8 ^ uStack_d6d8;
      auVar114._0_8_ = local_6f00 ^ local_d6e0;
      auVar114._16_8_ = uStack_6ef0 ^ uStack_d6d0;
      auVar114._24_8_ = uStack_6ee8 ^ uStack_d6c8;
      auVar21 = vpaddw_avx2(auVar115,auVar114);
      auVar123._16_8_ = uStack_70;
      auVar123._0_16_ = ZEXT116(0) * auVar247 + ZEXT116(1) * auVar9;
      auVar123._24_8_ = uStack_68;
      auVar21 = vpmullw_avx2(auVar123,auVar21);
      auVar17 = vpaddw_avx2(auVar17,auVar21);
      auVar237._16_8_ = local_1b60;
      auVar237._0_16_ = auVar250;
      auVar237._24_8_ = uStack_1b58;
      auVar124._16_8_ = uStack_dc90;
      auVar124._0_16_ = auVar244;
      auVar124._24_8_ = uStack_dc88;
      auVar21 = vpand_avx2(auVar237,auVar124);
      auVar174._16_8_ = uStack_dc10;
      auVar174._0_16_ = auVar246;
      auVar174._24_8_ = uStack_dc08;
      auVar18 = vpmaxsw_avx2(auVar174,auVar21);
      auVar238._16_8_ = local_1bd0;
      auVar238._0_16_ = auVar13;
      auVar238._24_8_ = uStack_1bc8;
      auVar125._16_8_ = uStack_dc90;
      auVar125._0_16_ = auVar244;
      auVar125._24_8_ = uStack_dc88;
      auVar21 = vpand_avx2(auVar238,auVar125);
      auVar18 = vpmaxsw_avx2(auVar18,auVar21);
      auVar239._16_8_ = local_1c40;
      auVar239._0_16_ = auVar10;
      auVar239._24_8_ = uStack_1c38;
      auVar126._16_8_ = uStack_dc90;
      auVar126._0_16_ = auVar244;
      auVar126._24_8_ = uStack_dc88;
      auVar21 = vpand_avx2(auVar239,auVar126);
      auVar18 = vpmaxsw_avx2(auVar18,auVar21);
      auVar240._16_8_ = local_1cb0;
      auVar240._0_16_ = auVar14;
      auVar240._24_8_ = uStack_1ca8;
      auVar127._16_8_ = uStack_dc90;
      auVar127._0_16_ = auVar244;
      auVar127._24_8_ = uStack_dc88;
      auVar21 = vpand_avx2(auVar240,auVar127);
      auVar19 = vpmaxsw_avx2(auVar18,auVar21);
      auVar170._16_8_ = uStack_dc10;
      auVar170._0_16_ = auVar246;
      auVar170._24_8_ = uStack_dc08;
      auVar169._16_8_ = local_1b60;
      auVar169._0_16_ = auVar250;
      auVar169._24_8_ = uStack_1b58;
      auVar21 = vpminsw_avx2(auVar170,auVar169);
      auVar171._16_8_ = local_1bd0;
      auVar171._0_16_ = auVar13;
      auVar171._24_8_ = uStack_1bc8;
      auVar21 = vpminsw_avx2(auVar21,auVar171);
      auVar172._16_8_ = local_1c40;
      auVar172._0_16_ = auVar10;
      auVar172._24_8_ = uStack_1c38;
      auVar21 = vpminsw_avx2(auVar21,auVar172);
      auVar173._16_8_ = local_1cb0;
      auVar173._0_16_ = auVar14;
      auVar173._24_8_ = uStack_1ca8;
      auVar16 = vpminsw_avx2(auVar21,auVar173);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar5) * 2);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar5) * 2);
      auVar247 = vpunpcklqdq_avx(auVar12,auVar11);
      auVar248._8_8_ = 0;
      auVar248._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar5) * 2);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar5) * 2);
      auVar250 = vpunpcklqdq_avx(auVar248,auVar14);
      local_17e0 = auVar247._0_8_;
      uStack_17d8 = auVar247._8_8_;
      auVar18._16_8_ = local_17e0;
      auVar18._0_16_ = auVar250;
      auVar18._24_8_ = uStack_17d8;
      auVar21._16_8_ = uStack_dc10;
      auVar21._0_16_ = auVar246;
      auVar21._24_8_ = uStack_dc08;
      auVar21 = vpsubw_avx2(auVar18,auVar21);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar9 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,2);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,3);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,4);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,5);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,6);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,7);
      uStack_630 = auVar9._0_8_;
      uStack_628 = auVar9._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_db24));
      auVar75._16_8_ = uStack_630;
      auVar75._0_16_ = auVar247;
      auVar75._24_8_ = uStack_628;
      auVar20 = vpsubusw_avx2(auVar75,auVar20);
      local_cd40 = auVar18._0_8_;
      uStack_cd38 = auVar18._8_8_;
      uStack_cd30 = auVar18._16_8_;
      uStack_cd28 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_71c0 = auVar21._0_8_;
      uStack_71b8 = auVar21._8_8_;
      uStack_71b0 = auVar21._16_8_;
      uStack_71a8 = auVar21._24_8_;
      auVar176._8_8_ = 0;
      auVar176._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar5) + 0x90) * 2);
      auVar249._8_8_ = 0;
      auVar249._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar5) * 2);
      auVar247 = vpunpcklqdq_avx(auVar176,auVar249);
      auVar245._8_8_ = 0;
      auVar245._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar5) + 0x1b0) * 2);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar5) + 0x120) * 2);
      auVar13 = vpunpcklqdq_avx(auVar245,auVar15);
      local_1850 = auVar247._0_8_;
      uStack_1848 = auVar247._8_8_;
      auVar46._16_8_ = local_1850;
      auVar46._0_16_ = auVar13;
      auVar46._24_8_ = uStack_1848;
      auVar20._16_8_ = uStack_dc10;
      auVar20._0_16_ = auVar246;
      auVar20._24_8_ = uStack_dc08;
      auVar21 = vpsubw_avx2(auVar46,auVar20);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar9 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,2);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,3);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,4);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,5);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,6);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,7);
      uStack_5f0 = auVar9._0_8_;
      uStack_5e8 = auVar9._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_db24));
      auVar74._16_8_ = uStack_5f0;
      auVar74._0_16_ = auVar247;
      auVar74._24_8_ = uStack_5e8;
      auVar20 = vpsubusw_avx2(auVar74,auVar20);
      local_ce20 = auVar18._0_8_;
      uStack_ce18 = auVar18._8_8_;
      uStack_ce10 = auVar18._16_8_;
      uStack_ce08 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7180 = auVar21._0_8_;
      uStack_7178 = auVar21._8_8_;
      uStack_7170 = auVar21._16_8_;
      uStack_7168 = auVar21._24_8_;
      auVar180._8_8_ = 0;
      auVar180._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar7) * 2);
      auVar179._8_8_ = 0;
      auVar179._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar7) * 2);
      auVar247 = vpunpcklqdq_avx(auVar180,auVar179);
      auVar178._8_8_ = 0;
      auVar178._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar7) * 2);
      auVar177._8_8_ = 0;
      auVar177._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar7) * 2);
      auVar10 = vpunpcklqdq_avx(auVar178,auVar177);
      local_18c0 = auVar247._0_8_;
      uStack_18b8 = auVar247._8_8_;
      auVar48._16_8_ = local_18c0;
      auVar48._0_16_ = auVar10;
      auVar48._24_8_ = uStack_18b8;
      auVar47._16_8_ = uStack_dc10;
      auVar47._0_16_ = auVar246;
      auVar47._24_8_ = uStack_dc08;
      auVar21 = vpsubw_avx2(auVar48,auVar47);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar9 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,2);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,3);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,4);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,5);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,6);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,7);
      uStack_5b0 = auVar9._0_8_;
      uStack_5a8 = auVar9._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_db24));
      auVar73._16_8_ = uStack_5b0;
      auVar73._0_16_ = auVar247;
      auVar73._24_8_ = uStack_5a8;
      auVar20 = vpsubusw_avx2(auVar73,auVar20);
      local_cf00 = auVar18._0_8_;
      uStack_cef8 = auVar18._8_8_;
      uStack_cef0 = auVar18._16_8_;
      uStack_cee8 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7140 = auVar21._0_8_;
      uStack_7138 = auVar21._8_8_;
      uStack_7130 = auVar21._16_8_;
      uStack_7128 = auVar21._24_8_;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar7) + 0x90) * 2);
      auVar183._8_8_ = 0;
      auVar183._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar7) * 2);
      auVar247 = vpunpcklqdq_avx(auVar184,auVar183);
      auVar182._8_8_ = 0;
      auVar182._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar7) + 0x1b0) * 2);
      auVar181._8_8_ = 0;
      auVar181._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar7) + 0x120) * 2);
      auVar14 = vpunpcklqdq_avx(auVar182,auVar181);
      local_1930 = auVar247._0_8_;
      uStack_1928 = auVar247._8_8_;
      auVar50._16_8_ = local_1930;
      auVar50._0_16_ = auVar14;
      auVar50._24_8_ = uStack_1928;
      auVar49._16_8_ = uStack_dc10;
      auVar49._0_16_ = auVar246;
      auVar49._24_8_ = uStack_dc08;
      auVar21 = vpsubw_avx2(auVar50,auVar49);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar9 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,2);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,3);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,4);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,5);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,6);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,7);
      uStack_570 = auVar9._0_8_;
      uStack_568 = auVar9._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_db24));
      auVar72._16_8_ = uStack_570;
      auVar72._0_16_ = auVar247;
      auVar72._24_8_ = uStack_568;
      auVar20 = vpsubusw_avx2(auVar72,auVar20);
      local_cfe0 = auVar18._0_8_;
      uStack_cfd8 = auVar18._8_8_;
      uStack_cfd0 = auVar18._16_8_;
      uStack_cfc8 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7100 = auVar21._0_8_;
      uStack_70f8 = auVar21._8_8_;
      uStack_70f0 = auVar21._16_8_;
      uStack_70e8 = auVar21._24_8_;
      auVar247 = vpinsrw_avx(ZEXT216(2),2,1);
      auVar247 = vpinsrw_avx(auVar247,2,2);
      auVar247 = vpinsrw_avx(auVar247,2,3);
      auVar247 = vpinsrw_avx(auVar247,2,4);
      auVar247 = vpinsrw_avx(auVar247,2,5);
      auVar247 = vpinsrw_avx(auVar247,2,6);
      auVar247 = vpinsrw_avx(auVar247,2,7);
      auVar9 = vpinsrw_avx(ZEXT216(2),2,1);
      auVar9 = vpinsrw_avx(auVar9,2,2);
      auVar9 = vpinsrw_avx(auVar9,2,3);
      auVar9 = vpinsrw_avx(auVar9,2,4);
      auVar9 = vpinsrw_avx(auVar9,2,5);
      auVar9 = vpinsrw_avx(auVar9,2,6);
      auVar9 = vpinsrw_avx(auVar9,2,7);
      uStack_130 = auVar9._0_8_;
      uStack_128 = auVar9._8_8_;
      auVar105._8_8_ = uStack_71b8 ^ uStack_cd38;
      auVar105._0_8_ = local_71c0 ^ local_cd40;
      auVar105._16_8_ = uStack_71b0 ^ uStack_cd30;
      auVar105._24_8_ = uStack_71a8 ^ uStack_cd28;
      auVar104._8_8_ = uStack_7178 ^ uStack_ce18;
      auVar104._0_8_ = local_7180 ^ local_ce20;
      auVar104._16_8_ = uStack_7170 ^ uStack_ce10;
      auVar104._24_8_ = uStack_7168 ^ uStack_ce08;
      auVar21 = vpaddw_avx2(auVar105,auVar104);
      auVar107._8_8_ = uStack_7138 ^ uStack_cef8;
      auVar107._0_8_ = local_7140 ^ local_cf00;
      auVar107._16_8_ = uStack_7130 ^ uStack_cef0;
      auVar107._24_8_ = uStack_7128 ^ uStack_cee8;
      auVar106._8_8_ = uStack_70f8 ^ uStack_cfd8;
      auVar106._0_8_ = local_7100 ^ local_cfe0;
      auVar106._16_8_ = uStack_70f0 ^ uStack_cfd0;
      auVar106._24_8_ = uStack_70e8 ^ uStack_cfc8;
      auVar18 = vpaddw_avx2(auVar107,auVar106);
      auVar21 = vpaddw_avx2(auVar21,auVar18);
      auVar120._16_8_ = uStack_130;
      auVar120._0_16_ = auVar247;
      auVar120._24_8_ = uStack_128;
      auVar21 = vpmullw_avx2(auVar120,auVar21);
      auVar17 = vpaddw_avx2(auVar17,auVar21);
      auVar188._8_8_ = 0;
      auVar188._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar6) * 2);
      auVar187._8_8_ = 0;
      auVar187._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar6) * 2);
      auVar247 = vpunpcklqdq_avx(auVar188,auVar187);
      auVar186._8_8_ = 0;
      auVar186._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar6) * 2);
      auVar185._8_8_ = 0;
      auVar185._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar6) * 2);
      auVar248 = vpunpcklqdq_avx(auVar186,auVar185);
      local_19a0 = auVar247._0_8_;
      uStack_1998 = auVar247._8_8_;
      auVar52._16_8_ = local_19a0;
      auVar52._0_16_ = auVar248;
      auVar52._24_8_ = uStack_1998;
      auVar51._16_8_ = uStack_dc10;
      auVar51._0_16_ = auVar246;
      auVar51._24_8_ = uStack_dc08;
      auVar21 = vpsubw_avx2(auVar52,auVar51);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar9 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,2);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,3);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,4);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,5);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,6);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,7);
      uStack_530 = auVar9._0_8_;
      uStack_528 = auVar9._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_db24));
      auVar71._16_8_ = uStack_530;
      auVar71._0_16_ = auVar247;
      auVar71._24_8_ = uStack_528;
      auVar20 = vpsubusw_avx2(auVar71,auVar20);
      local_d0c0 = auVar18._0_8_;
      uStack_d0b8 = auVar18._8_8_;
      uStack_d0b0 = auVar18._16_8_;
      uStack_d0a8 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_70c0 = auVar21._0_8_;
      uStack_70b8 = auVar21._8_8_;
      uStack_70b0 = auVar21._16_8_;
      uStack_70a8 = auVar21._24_8_;
      auVar192._8_8_ = 0;
      auVar192._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar6) + 0x90) * 2);
      auVar191._8_8_ = 0;
      auVar191._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar6) * 2);
      auVar247 = vpunpcklqdq_avx(auVar192,auVar191);
      auVar190._8_8_ = 0;
      auVar190._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar6) + 0x1b0) * 2);
      auVar189._8_8_ = 0;
      auVar189._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar6) + 0x120) * 2);
      auVar11 = vpunpcklqdq_avx(auVar190,auVar189);
      local_1a10 = auVar247._0_8_;
      uStack_1a08 = auVar247._8_8_;
      auVar54._16_8_ = local_1a10;
      auVar54._0_16_ = auVar11;
      auVar54._24_8_ = uStack_1a08;
      auVar53._16_8_ = uStack_dc10;
      auVar53._0_16_ = auVar246;
      auVar53._24_8_ = uStack_dc08;
      auVar21 = vpsubw_avx2(auVar54,auVar53);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar9 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,2);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,3);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,4);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,5);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,6);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,7);
      uStack_4f0 = auVar9._0_8_;
      uStack_4e8 = auVar9._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_db24));
      auVar70._16_8_ = uStack_4f0;
      auVar70._0_16_ = auVar247;
      auVar70._24_8_ = uStack_4e8;
      auVar20 = vpsubusw_avx2(auVar70,auVar20);
      local_d1a0 = auVar18._0_8_;
      uStack_d198 = auVar18._8_8_;
      uStack_d190 = auVar18._16_8_;
      uStack_d188 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7080 = auVar21._0_8_;
      uStack_7078 = auVar21._8_8_;
      uStack_7070 = auVar21._16_8_;
      uStack_7068 = auVar21._24_8_;
      auVar196._8_8_ = 0;
      auVar196._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar8) * 2);
      auVar195._8_8_ = 0;
      auVar195._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar8) * 2);
      auVar247 = vpunpcklqdq_avx(auVar196,auVar195);
      auVar194._8_8_ = 0;
      auVar194._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar8) * 2);
      auVar193._8_8_ = 0;
      auVar193._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar8) * 2);
      auVar12 = vpunpcklqdq_avx(auVar194,auVar193);
      local_1a80 = auVar247._0_8_;
      uStack_1a78 = auVar247._8_8_;
      auVar56._16_8_ = local_1a80;
      auVar56._0_16_ = auVar12;
      auVar56._24_8_ = uStack_1a78;
      auVar55._16_8_ = uStack_dc10;
      auVar55._0_16_ = auVar246;
      auVar55._24_8_ = uStack_dc08;
      auVar21 = vpsubw_avx2(auVar56,auVar55);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar9 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,2);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,3);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,4);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,5);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,6);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,7);
      uStack_4b0 = auVar9._0_8_;
      uStack_4a8 = auVar9._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_db24));
      auVar69._16_8_ = uStack_4b0;
      auVar69._0_16_ = auVar247;
      auVar69._24_8_ = uStack_4a8;
      auVar20 = vpsubusw_avx2(auVar69,auVar20);
      local_d280 = auVar18._0_8_;
      uStack_d278 = auVar18._8_8_;
      uStack_d270 = auVar18._16_8_;
      uStack_d268 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7040 = auVar21._0_8_;
      uStack_7038 = auVar21._8_8_;
      uStack_7030 = auVar21._16_8_;
      uStack_7028 = auVar21._24_8_;
      auVar200._8_8_ = 0;
      auVar200._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar8) + 0x90) * 2);
      auVar199._8_8_ = 0;
      auVar199._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar8) * 2);
      auVar247 = vpunpcklqdq_avx(auVar200,auVar199);
      auVar198._8_8_ = 0;
      auVar198._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar8) + 0x1b0) * 2);
      auVar197._8_8_ = 0;
      auVar197._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar8) + 0x120) * 2);
      auVar15 = vpunpcklqdq_avx(auVar198,auVar197);
      local_1af0 = auVar247._0_8_;
      uStack_1ae8 = auVar247._8_8_;
      auVar58._16_8_ = local_1af0;
      auVar58._0_16_ = auVar15;
      auVar58._24_8_ = uStack_1ae8;
      auVar57._16_8_ = uStack_dc10;
      auVar57._0_16_ = auVar246;
      auVar57._24_8_ = uStack_dc08;
      auVar21 = vpsubw_avx2(auVar58,auVar57);
      auVar18 = vpsraw_avx2(auVar21,ZEXT416(0xf));
      auVar21 = vpabsw_avx2(auVar21);
      auVar247 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,2);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,3);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,4);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,5);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,6);
      auVar247 = vpinsrw_avx(auVar247,in_R8D & 0xffff,7);
      auVar9 = vpinsrw_avx(ZEXT216(local_c264),in_R8D & 0xffff,1);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,2);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,3);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,4);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,5);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,6);
      auVar9 = vpinsrw_avx(auVar9,in_R8D & 0xffff,7);
      uStack_470 = auVar9._0_8_;
      uStack_468 = auVar9._8_8_;
      auVar20 = vpsrlw_avx2(auVar21,ZEXT416(local_db24));
      auVar68._16_8_ = uStack_470;
      auVar68._0_16_ = auVar247;
      auVar68._24_8_ = uStack_468;
      auVar20 = vpsubusw_avx2(auVar68,auVar20);
      local_d360 = auVar18._0_8_;
      uStack_d358 = auVar18._8_8_;
      uStack_d350 = auVar18._16_8_;
      uStack_d348 = auVar18._24_8_;
      auVar21 = vpminsw_avx2(auVar21,auVar20);
      auVar21 = vpaddw_avx2(auVar18,auVar21);
      local_7000 = auVar21._0_8_;
      uStack_6ff8 = auVar21._8_8_;
      uStack_6ff0 = auVar21._16_8_;
      uStack_6fe8 = auVar21._24_8_;
      auVar247 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar247 = vpinsrw_avx(auVar247,1,2);
      auVar247 = vpinsrw_avx(auVar247,1,3);
      auVar247 = vpinsrw_avx(auVar247,1,4);
      auVar247 = vpinsrw_avx(auVar247,1,5);
      auVar247 = vpinsrw_avx(auVar247,1,6);
      auVar247 = vpinsrw_avx(auVar247,1,7);
      auVar9 = vpinsrw_avx(ZEXT216(1),1,1);
      auVar9 = vpinsrw_avx(auVar9,1,2);
      auVar9 = vpinsrw_avx(auVar9,1,3);
      auVar9 = vpinsrw_avx(auVar9,1,4);
      auVar9 = vpinsrw_avx(auVar9,1,5);
      auVar9 = vpinsrw_avx(auVar9,1,6);
      auVar9 = vpinsrw_avx(auVar9,1,7);
      auVar245 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar247;
      uStack_f0 = auVar245._0_8_;
      uStack_e8 = auVar245._8_8_;
      auVar109._8_8_ = uStack_70b8 ^ uStack_d0b8;
      auVar109._0_8_ = local_70c0 ^ local_d0c0;
      auVar109._16_8_ = uStack_70b0 ^ uStack_d0b0;
      auVar109._24_8_ = uStack_70a8 ^ uStack_d0a8;
      auVar108._8_8_ = uStack_7078 ^ uStack_d198;
      auVar108._0_8_ = local_7080 ^ local_d1a0;
      auVar108._16_8_ = uStack_7070 ^ uStack_d190;
      auVar108._24_8_ = uStack_7068 ^ uStack_d188;
      auVar21 = vpaddw_avx2(auVar109,auVar108);
      auVar111._8_8_ = uStack_7038 ^ uStack_d278;
      auVar111._0_8_ = local_7040 ^ local_d280;
      auVar111._16_8_ = uStack_7030 ^ uStack_d270;
      auVar111._24_8_ = uStack_7028 ^ uStack_d268;
      auVar110._8_8_ = uStack_6ff8 ^ uStack_d358;
      auVar110._0_8_ = local_7000 ^ local_d360;
      auVar110._16_8_ = uStack_6ff0 ^ uStack_d350;
      auVar110._24_8_ = uStack_6fe8 ^ uStack_d348;
      auVar18 = vpaddw_avx2(auVar111,auVar110);
      auVar21 = vpaddw_avx2(auVar21,auVar18);
      auVar121._16_8_ = uStack_f0;
      auVar121._0_16_ = ZEXT116(0) * auVar247 + ZEXT116(1) * auVar9;
      auVar121._24_8_ = uStack_e8;
      auVar21 = vpmullw_avx2(auVar121,auVar21);
      auVar21 = vpaddw_avx2(auVar17,auVar21);
      auVar229._16_8_ = local_17e0;
      auVar229._0_16_ = auVar250;
      auVar229._24_8_ = uStack_17d8;
      auVar132._16_8_ = uStack_dc90;
      auVar132._0_16_ = auVar244;
      auVar132._24_8_ = uStack_dc88;
      auVar17 = vpand_avx2(auVar229,auVar132);
      auVar18 = vpmaxsw_avx2(auVar19,auVar17);
      auVar230._16_8_ = local_1850;
      auVar230._0_16_ = auVar13;
      auVar230._24_8_ = uStack_1848;
      auVar133._16_8_ = uStack_dc90;
      auVar133._0_16_ = auVar244;
      auVar133._24_8_ = uStack_dc88;
      auVar17 = vpand_avx2(auVar230,auVar133);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar231._16_8_ = local_18c0;
      auVar231._0_16_ = auVar10;
      auVar231._24_8_ = uStack_18b8;
      auVar134._16_8_ = uStack_dc90;
      auVar134._0_16_ = auVar244;
      auVar134._24_8_ = uStack_dc88;
      auVar17 = vpand_avx2(auVar231,auVar134);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar232._16_8_ = local_1930;
      auVar232._0_16_ = auVar14;
      auVar232._24_8_ = uStack_1928;
      auVar135._16_8_ = uStack_dc90;
      auVar135._0_16_ = auVar244;
      auVar135._24_8_ = uStack_dc88;
      auVar17 = vpand_avx2(auVar232,auVar135);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar233._16_8_ = local_19a0;
      auVar233._0_16_ = auVar248;
      auVar233._24_8_ = uStack_1998;
      auVar136._16_8_ = uStack_dc90;
      auVar136._0_16_ = auVar244;
      auVar136._24_8_ = uStack_dc88;
      auVar17 = vpand_avx2(auVar233,auVar136);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar234._16_8_ = local_1a10;
      auVar234._0_16_ = auVar11;
      auVar234._24_8_ = uStack_1a08;
      auVar137._16_8_ = uStack_dc90;
      auVar137._0_16_ = auVar244;
      auVar137._24_8_ = uStack_dc88;
      auVar17 = vpand_avx2(auVar234,auVar137);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar235._16_8_ = local_1a80;
      auVar235._0_16_ = auVar12;
      auVar235._24_8_ = uStack_1a78;
      auVar138._16_8_ = uStack_dc90;
      auVar138._0_16_ = auVar244;
      auVar138._24_8_ = uStack_dc88;
      auVar17 = vpand_avx2(auVar235,auVar138);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar236._16_8_ = local_1af0;
      auVar236._0_16_ = auVar15;
      auVar236._24_8_ = uStack_1ae8;
      auVar139._16_8_ = uStack_dc90;
      auVar139._0_16_ = auVar244;
      auVar139._24_8_ = uStack_dc88;
      auVar17 = vpand_avx2(auVar236,auVar139);
      auVar18 = vpmaxsw_avx2(auVar18,auVar17);
      auVar161._16_8_ = local_17e0;
      auVar161._0_16_ = auVar250;
      auVar161._24_8_ = uStack_17d8;
      auVar17 = vpminsw_avx2(auVar16,auVar161);
      auVar162._16_8_ = local_1850;
      auVar162._0_16_ = auVar13;
      auVar162._24_8_ = uStack_1848;
      auVar17 = vpminsw_avx2(auVar17,auVar162);
      auVar163._16_8_ = local_18c0;
      auVar163._0_16_ = auVar10;
      auVar163._24_8_ = uStack_18b8;
      auVar17 = vpminsw_avx2(auVar17,auVar163);
      auVar164._16_8_ = local_1930;
      auVar164._0_16_ = auVar14;
      auVar164._24_8_ = uStack_1928;
      auVar17 = vpminsw_avx2(auVar17,auVar164);
      auVar165._16_8_ = local_19a0;
      auVar165._0_16_ = auVar248;
      auVar165._24_8_ = uStack_1998;
      auVar17 = vpminsw_avx2(auVar17,auVar165);
      auVar166._16_8_ = local_1a10;
      auVar166._0_16_ = auVar11;
      auVar166._24_8_ = uStack_1a08;
      auVar17 = vpminsw_avx2(auVar17,auVar166);
      auVar167._16_8_ = local_1a80;
      auVar167._0_16_ = auVar12;
      auVar167._24_8_ = uStack_1a78;
      auVar17 = vpminsw_avx2(auVar17,auVar167);
      auVar168._16_8_ = local_1af0;
      auVar168._0_16_ = auVar15;
      auVar168._24_8_ = uStack_1ae8;
      auVar19 = vpminsw_avx2(auVar17,auVar168);
      uStack_9038 = SUB328(ZEXT832(0),4);
      auVar17 = vpcmpgtw_avx2(ZEXT832(uStack_9038) << 0x40,auVar21);
      auVar21 = vpaddw_avx2(auVar21,auVar17);
      auVar247 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar247 = vpinsrw_avx(auVar247,8,2);
      auVar247 = vpinsrw_avx(auVar247,8,3);
      auVar247 = vpinsrw_avx(auVar247,8,4);
      auVar247 = vpinsrw_avx(auVar247,8,5);
      auVar247 = vpinsrw_avx(auVar247,8,6);
      auVar247 = vpinsrw_avx(auVar247,8,7);
      auVar9 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar9 = vpinsrw_avx(auVar9,8,2);
      auVar9 = vpinsrw_avx(auVar9,8,3);
      auVar9 = vpinsrw_avx(auVar9,8,4);
      auVar9 = vpinsrw_avx(auVar9,8,5);
      auVar9 = vpinsrw_avx(auVar9,8,6);
      auVar9 = vpinsrw_avx(auVar9,8,7);
      auVar250 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar247;
      uStack_170 = auVar250._0_8_;
      uStack_168 = auVar250._8_8_;
      auVar102._16_8_ = uStack_170;
      auVar102._0_16_ = ZEXT116(0) * auVar247 + ZEXT116(1) * auVar9;
      auVar102._24_8_ = uStack_168;
      auVar21 = vpaddw_avx2(auVar21,auVar102);
      auVar21 = vpsraw_avx2(auVar21,ZEXT416(4));
      auVar103._16_8_ = uStack_dc10;
      auVar103._0_16_ = auVar246;
      auVar103._24_8_ = uStack_dc08;
      auVar21 = vpaddw_avx2(auVar103,auVar21);
      auVar21 = vpmaxsw_avx2(auVar21,auVar19);
      auVar21 = vpminsw_avx2(auVar21,auVar18);
      auVar247 = vpsrldq_avx(local_9210,8);
      local_9300 = auVar247._0_8_;
      *(undefined8 *)(in_RDI + (long)(local_dccc * in_ESI) * 2) = local_9300;
      uStack_1d38 = SUB168(ZEXT816(0),4);
      auVar247._8_8_ = uStack_9158;
      auVar247._0_8_ = local_9160;
      auVar246._8_8_ = 0;
      auVar246._0_8_ = uStack_1d38;
      auVar247 = vpunpcklqdq_avx(auVar247,auVar246 << 0x40);
      local_9340 = auVar247._0_8_;
      *(undefined8 *)(in_RDI + (long)((local_dccc + 1) * in_ESI) * 2) = local_9340;
      auVar247 = vpsrldq_avx(auVar21._0_16_,8);
      local_9380 = auVar247._0_8_;
      *(undefined8 *)(in_RDI + (long)((local_dccc + 2) * in_ESI) * 2) = local_9380;
      auVar241._8_8_ = 0;
      auVar241._0_8_ = uStack_1d38;
      auVar247 = vpunpcklqdq_avx(auVar21._0_16_,auVar241 << 0x40);
      local_93c0 = auVar247._0_8_;
      *(undefined8 *)(in_RDI + (long)((local_dccc + 3) * in_ESI) * 2) = local_93c0;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_0)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  }
}